

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Sec(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppnet::Timer> *in_RDI;
  shared_ptr<cppnet::Timer> sVar1;
  TIME_UNIT local_2c;
  TIME_UNIT local_28 [2];
  shared_ptr<cppnet::TimerContainer> local_20;
  
  local_28[0] = 0;
  local_28[1] = 0;
  local_2c = TU_MILLISECOND;
  std::make_shared<cppnet::TimerContainer,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            ((void **)&local_20,local_28,&local_2c);
  std::shared_ptr<cppnet::Timer>::shared_ptr<cppnet::TimerContainer,void>(in_RDI,&local_20);
  std::shared_ptr<cppnet::TimerContainer>::~shared_ptr(&local_20);
  sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<cppnet::Timer>)
         sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Sec() {
    return std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
}